

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

void cmListFileLexerAppend(cmListFileLexer *lexer,char *text,int length)

{
  int iVar1;
  char *__dest;
  int newSize;
  char *temp;
  int length_local;
  char *text_local;
  cmListFileLexer *lexer_local;
  
  iVar1 = (lexer->token).length + length + 1;
  if (((lexer->token).text == (char *)0x0) || (lexer->size < iVar1)) {
    __dest = (char *)malloc((long)iVar1);
    if ((lexer->token).text != (char *)0x0) {
      memcpy(__dest,(lexer->token).text,(long)(lexer->token).length);
      free((lexer->token).text);
    }
    memcpy(__dest + (lexer->token).length,text,(long)length);
    __dest[(lexer->token).length + length] = '\0';
    (lexer->token).text = __dest;
    (lexer->token).length = length + (lexer->token).length;
    lexer->size = iVar1;
  }
  else {
    strcpy((lexer->token).text + (lexer->token).length,text);
    (lexer->token).length = length + (lexer->token).length;
  }
  return;
}

Assistant:

static void cmListFileLexerAppend(cmListFileLexer* lexer, const char* text,
                                  int length)
{
  char* temp;
  int newSize;

  /* If the appended text will fit in the buffer, do not reallocate.  */
  newSize = lexer->token.length + length + 1;
  if (lexer->token.text && newSize <= lexer->size) {
    strcpy(lexer->token.text + lexer->token.length, text);
    lexer->token.length += length;
    return;
  }

  /* We need to extend the buffer.  */
  temp = malloc(newSize);
  if (lexer->token.text) {
    memcpy(temp, lexer->token.text, lexer->token.length);
    free(lexer->token.text);
  }
  memcpy(temp + lexer->token.length, text, length);
  temp[lexer->token.length + length] = 0;
  lexer->token.text = temp;
  lexer->token.length += length;
  lexer->size = newSize;
}